

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

value * __thiscall mjs::object::get(value *__return_storage_ptr__,object *this,wstring_view *name)

{
  uint32_t uVar1;
  uint uVar2;
  undefined8 in_RAX;
  object *this_00;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pVar3 = find(this,*name);
  if (pVar3.first == (property *)0x0) {
    this_00 = this;
    do {
      uVar1 = (this_00->prototype_).pos_;
      uStack_38 = CONCAT44(uVar1,(undefined4)uStack_38);
      if (uVar1 == 0) goto LAB_00161a52;
      this_00 = gc_heap_ptr_untracked<mjs::object,_true>::dereference
                          ((gc_heap_ptr_untracked<mjs::object,_true> *)((long)&uStack_38 + 4),
                           this->heap_);
      pVar3 = find(this_00,*name);
      if (pVar3.first != (property *)0x0) {
        property::get(__return_storage_ptr__,pVar3.first,this);
        goto LAB_00161a4e;
      }
      uVar2 = (*this_00->_vptr_object[6])(this_00,name,pVar3.second);
      if (0x10 < uVar2) {
        __assert_fail("static_cast<unsigned>(a) <= static_cast<unsigned>(property_attribute::invalid)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                      ,0x24,"bool mjs::is_valid(property_attribute)");
      }
    } while (uVar2 == 0x10);
    (**this_00->_vptr_object)(__return_storage_ptr__,this_00,name);
LAB_00161a4e:
    if (uVar1 == 0) {
LAB_00161a52:
      value::value(__return_storage_ptr__,(value *)&value::undefined);
    }
  }
  else {
    property::get(__return_storage_ptr__,pVar3.first,this);
  }
  return __return_storage_ptr__;
}

Assistant:

value object::get(const std::wstring_view& name) const {
    if (auto it = find(name).first) {
        return it->get(*this);
    }
    for (auto p = prototype_; p; ) {
        auto& proto = p.dereference(heap());
        if (auto it = proto.find(name).first) {
            return it->get(*this);
        } else if (is_valid(proto.own_property_attributes(name))) {
            return proto.get(name);
        }
        p = proto.prototype_;
    }

    return value::undefined;
}